

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
bioparser::Parser<biosoup::Sequence>::Parser
          (Parser<biosoup::Sequence> *this,gzFile file,uint32_t storage_size)

{
  ulong __n;
  allocator_type local_3e;
  value_type local_3d [19];
  allocator_type local_2a;
  value_type local_29;
  _func_int_gzFile_s_ptr *local_28;
  uint32_t local_1c;
  gzFile pgStack_18;
  uint32_t storage_size_local;
  gzFile file_local;
  Parser<biosoup::Sequence> *this_local;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_001a95a0;
  local_28 = gzclose;
  local_1c = storage_size;
  pgStack_18 = file;
  file_local = (gzFile)this;
  std::unique_ptr<gzFile_s,int(*)(gzFile_s*)>::unique_ptr<int(*)(gzFile_s*),void>
            ((unique_ptr<gzFile_s,int(*)(gzFile_s*)> *)&this->file_,file,&local_28);
  local_29 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->buffer_,0x10000,&local_29,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  this->buffer_ptr_ = 0;
  this->buffer_bytes_ = 0;
  __n = (ulong)local_1c;
  local_3d[0] = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->storage_,__n,local_3d,&local_3e);
  std::allocator<char>::~allocator(&local_3e);
  this->storage_ptr_ = 0;
  return;
}

Assistant:

Parser(gzFile file, std::uint32_t storage_size)
      : file_(file, gzclose),
        buffer_(65536, 0),  // 64 kB
        buffer_ptr_(0),
        buffer_bytes_(0),
        storage_(storage_size, 0),
        storage_ptr_(0) {}